

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

string * __thiscall
ExceptionFreeserf::get_description_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionFreeserf *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ExceptionFreeserf *local_18;
  ExceptionFreeserf *this_local;
  
  local_18 = this;
  this_local = (ExceptionFreeserf *)__return_storage_ptr__;
  (**(code **)(*(long *)this + 0x20))();
  std::operator+(&local_58,"[",&local_78);
  std::operator+(&local_38,&local_58,"] ");
  std::operator+(__return_storage_ptr__,&local_38,&this->description);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string
ExceptionFreeserf::get_description() const {
  return "[" + get_system() + "] " + description;
}